

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O3

CharFormat testing::internal::PrintAsStringLiteralTo(wchar_t c,ostream *os)

{
  long lVar1;
  CharFormat CVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (c == L'\"') {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\\\"",2);
    CVar2 = kSpecialEscape;
  }
  else {
    if (c != L'\'') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        CVar2 = PrintAsCharLiteralTo<wchar_t,wchar_t>(c,os);
        return CVar2;
      }
      goto LAB_0016200a;
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
    CVar2 = kAsIs;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return CVar2;
  }
LAB_0016200a:
  __stack_chk_fail();
}

Assistant:

static CharFormat PrintAsStringLiteralTo(wchar_t c, ostream* os) {
  switch (c) {
    case L'\'':
      *os << "'";
      return kAsIs;
    case L'"':
      *os << "\\\"";
      return kSpecialEscape;
    default:
      return PrintAsCharLiteralTo<wchar_t>(c, os);
  }
}